

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeWorkItem.cpp
# Opt level: O2

void __thiscall
JITTimeWorkItem::InitializeReader
          (JITTimeWorkItem *this,ByteCodeReader *reader,
          StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
          *statementReader,ArenaAllocator *alloc)

{
  Type TVar1;
  int iVar2;
  code *pcVar3;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  *this_00;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  JITLoopHeaderIDL *pJVar7;
  CodeGenWorkItemIDL *pCVar8;
  List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar9;
  StatementMapIDL *pSVar10;
  byte *pbVar11;
  FunctionProxy *this_01;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  undefined4 *puVar12;
  Type *pTVar13;
  Type *ppSVar14;
  uint i;
  ulong uVar15;
  uint i_1;
  uint index;
  JITTimeFunctionBody *this_03;
  SmallSpanSequence *statementMap;
  StatementMapIDL *local_60;
  JITTimeFunctionBody *local_58;
  ByteCodeReader *local_50;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  *local_48;
  ArenaAllocator *local_40;
  uint local_34;
  
  pCVar8 = this->m_workItemData;
  local_34 = 0;
  local_50 = reader;
  local_48 = statementReader;
  local_40 = alloc;
  if (pCVar8->type == '\x01') {
    pJVar7 = GetLoopHeader(this);
    local_34 = pJVar7->startOffset;
    pCVar8 = this->m_workItemData;
  }
  if (pCVar8->isJitInDebugMode != '\0') {
    pLVar9 = JsUtil::
             List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(local_40,4);
    this->m_fullStatementList = pLVar9;
    pSVar10 = JITTimeFunctionBody::GetFullStatementMap(&this->m_jitBody);
    uVar15 = 0;
    while( true ) {
      uVar5 = JITTimeFunctionBody::GetFullStatementMapCount(&this->m_jitBody);
      if (uVar5 <= uVar15) break;
      local_60 = pSVar10;
      JsUtil::
      List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(this->m_fullStatementList,(StatementMap **)&local_60);
      uVar15 = uVar15 + 1;
      pSVar10 = pSVar10 + 1;
    }
  }
  this_03 = &this->m_jitBody;
  pbVar11 = JITTimeFunctionBody::GetByteCodeBuffer(this_03);
  uVar5 = JITTimeFunctionBody::GetByteCodeLength(this_03);
  Js::ByteCodeReader::Create(local_50,pbVar11,local_34,uVar5);
  this_01 = (FunctionProxy *)JITTimeFunctionBody::GetAddr(this_03);
  this_02 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)Js::FunctionProxy::GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)4,void*>
                         (this_01);
  if (this->m_fullStatementList != (ArenaStatementMapList *)0x0) {
    uVar6 = JITTimeFunctionBody::GetFullStatementMapCount(this_03);
    uVar5 = (this_02->
            super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>)
            .count;
    if (uVar6 != uVar5 || (int)uVar5 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                         ,100,
                         "(!m_fullStatementList || ((int)m_jitBody.GetFullStatementMapCount() == runtimeMap->Count() && runtimeMap->Count() >= 0))"
                         ,
                         "!m_fullStatementList || ((int)m_jitBody.GetFullStatementMapCount() == runtimeMap->Count() && runtimeMap->Count() >= 0)"
                        );
      if (!bVar4) {
LAB_00520118:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar12 = 0;
    }
  }
  index = 0;
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_58 = this_03;
  do {
    uVar5 = JITTimeFunctionBody::GetFullStatementMapCount(this_03);
    if (uVar5 <= index) {
      bVar4 = JITTimeFunctionBody::InitializeStatementMap(this_03,&this->m_statementMap,local_40);
      this_00 = local_48;
      if (local_48 !=
          (StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
           *)0x0) {
        statementMap = (SmallSpanSequence *)0x0;
        if (bVar4) {
          statementMap = &this->m_statementMap;
        }
        pbVar11 = JITTimeFunctionBody::GetByteCodeBuffer(this_03);
        Js::
        StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
        ::Create(this_00,pbVar11,local_34,statementMap,this->m_fullStatementList);
      }
      return;
    }
    pTVar13 = JsUtil::
              List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_02,index);
    iVar2 = (pTVar13->ptr->byteCodeSpan).begin;
    ppSVar14 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this->m_fullStatementList,index);
    if (iVar2 != ((*ppSVar14)->byteCodeSpan).begin) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                         ,0x67,
                         "(runtimeMap->Item(i)->byteCodeSpan.begin == m_fullStatementList->Item(i)->byteCodeSpan.begin)"
                         ,
                         "runtimeMap->Item(i)->byteCodeSpan.begin == m_fullStatementList->Item(i)->byteCodeSpan.begin"
                        );
      if (!bVar4) goto LAB_00520118;
      *puVar12 = 0;
    }
    pTVar13 = JsUtil::
              List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_02,index);
    iVar2 = (pTVar13->ptr->byteCodeSpan).end;
    ppSVar14 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this->m_fullStatementList,index);
    if (iVar2 != ((*ppSVar14)->byteCodeSpan).end) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                         ,0x68,
                         "(runtimeMap->Item(i)->byteCodeSpan.end == m_fullStatementList->Item(i)->byteCodeSpan.end)"
                         ,
                         "runtimeMap->Item(i)->byteCodeSpan.end == m_fullStatementList->Item(i)->byteCodeSpan.end"
                        );
      if (!bVar4) goto LAB_00520118;
      *puVar12 = 0;
    }
    pTVar13 = JsUtil::
              List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_02,index);
    iVar2 = (pTVar13->ptr->sourceSpan).begin;
    ppSVar14 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this->m_fullStatementList,index);
    if (iVar2 != ((*ppSVar14)->sourceSpan).begin) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                         ,0x69,
                         "(runtimeMap->Item(i)->sourceSpan.begin == m_fullStatementList->Item(i)->sourceSpan.begin)"
                         ,
                         "runtimeMap->Item(i)->sourceSpan.begin == m_fullStatementList->Item(i)->sourceSpan.begin"
                        );
      if (!bVar4) goto LAB_00520118;
      *puVar12 = 0;
    }
    pTVar13 = JsUtil::
              List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_02,index);
    iVar2 = (pTVar13->ptr->sourceSpan).end;
    ppSVar14 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this->m_fullStatementList,index);
    if (iVar2 != ((*ppSVar14)->sourceSpan).end) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                         ,0x6a,
                         "(runtimeMap->Item(i)->sourceSpan.end == m_fullStatementList->Item(i)->sourceSpan.end)"
                         ,
                         "runtimeMap->Item(i)->sourceSpan.end == m_fullStatementList->Item(i)->sourceSpan.end"
                        );
      if (!bVar4) goto LAB_00520118;
      *puVar12 = 0;
    }
    pTVar13 = JsUtil::
              List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_02,index);
    TVar1 = pTVar13->ptr->isSubexpression;
    ppSVar14 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this->m_fullStatementList,index);
    this_03 = local_58;
    if (TVar1 != (*ppSVar14)->isSubexpression) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                         ,0x6b,
                         "(runtimeMap->Item(i)->isSubexpression == m_fullStatementList->Item(i)->isSubexpression)"
                         ,
                         "runtimeMap->Item(i)->isSubexpression == m_fullStatementList->Item(i)->isSubexpression"
                        );
      if (!bVar4) goto LAB_00520118;
      *puVar12 = 0;
    }
    index = index + 1;
  } while( true );
}

Assistant:

void
JITTimeWorkItem::InitializeReader(
    Js::ByteCodeReader * reader,
    Js::StatementReader<Js::FunctionBody::ArenaStatementMapList> * statementReader, ArenaAllocator* alloc)
{
    uint startOffset = IsLoopBody() ? GetLoopHeader()->startOffset : 0;

    if (IsJitInDebugMode())
    {
        // TODO: OOP JIT, directly use the array rather than making a list
        m_fullStatementList = Js::FunctionBody::ArenaStatementMapList::New(alloc);
        CompileAssert(sizeof(StatementMapIDL) == sizeof(Js::FunctionBody::StatementMap));

        StatementMapIDL * fullArr = m_jitBody.GetFullStatementMap();
        for (uint i = 0; i < m_jitBody.GetFullStatementMapCount(); ++i)
        {
            m_fullStatementList->Add((Js::FunctionBody::StatementMap*)&fullArr[i]);
        }
    }
#if DBG
    reader->Create(m_jitBody.GetByteCodeBuffer(), startOffset, m_jitBody.GetByteCodeLength());
    if (!JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        Js::FunctionBody::StatementMapList * runtimeMap = ((Js::FunctionBody*)m_jitBody.GetAddr())->GetStatementMaps();
        Assert(!m_fullStatementList || ((int)m_jitBody.GetFullStatementMapCount() == runtimeMap->Count() && runtimeMap->Count() >= 0));
        for (uint i = 0; i < m_jitBody.GetFullStatementMapCount(); ++i)
        {
            Assert(runtimeMap->Item(i)->byteCodeSpan.begin == m_fullStatementList->Item(i)->byteCodeSpan.begin);
            Assert(runtimeMap->Item(i)->byteCodeSpan.end == m_fullStatementList->Item(i)->byteCodeSpan.end);
            Assert(runtimeMap->Item(i)->sourceSpan.begin == m_fullStatementList->Item(i)->sourceSpan.begin);
            Assert(runtimeMap->Item(i)->sourceSpan.end == m_fullStatementList->Item(i)->sourceSpan.end);
            Assert(runtimeMap->Item(i)->isSubexpression == m_fullStatementList->Item(i)->isSubexpression);
        }
    }
#else
    reader->Create(m_jitBody.GetByteCodeBuffer(), startOffset);
#endif
    bool hasSpanSequenceMap = m_jitBody.InitializeStatementMap(&m_statementMap, alloc);
    Js::SmallSpanSequence * spanSeq = hasSpanSequenceMap ? &m_statementMap : nullptr;
    if (statementReader)
    {
        statementReader->Create(m_jitBody.GetByteCodeBuffer(), startOffset, spanSeq, m_fullStatementList);
    }
}